

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O0

void Cba_NtkFree(Cba_Ntk_t *p)

{
  Cba_Ntk_t *p_local;
  
  Vec_IntErase(&p->vInputs);
  Vec_IntErase(&p->vOutputs);
  Vec_IntErase(&p->vOrder);
  Vec_IntErase(&p->vSeq);
  Vec_StrErase(&p->vObjType);
  Vec_IntErase(&p->vObjFin0);
  Vec_IntErase(&p->vObjFon0);
  Vec_IntErase(&p->vFinFon);
  Vec_IntErase(&p->vFonObj);
  Vec_IntErase(&p->vObjCopy);
  Vec_IntErase(&p->vObjFunc);
  Vec_IntErase(&p->vObjName);
  Vec_IntErase(&p->vObjAttr);
  Vec_IntErase(&p->vAttrSto);
  Vec_IntErase(&p->vFonCopy);
  Vec_IntErase(&p->vFonName);
  Vec_IntErase(&p->vFonRange);
  Vec_IntErase(&p->vFonPrev);
  Vec_IntErase(&p->vFonNext);
  Vec_IntErase(&p->vFinFon0);
  Vec_IntErase(&p->vFinObj);
  Vec_IntErase(&p->vNtkObjs);
  Vec_IntErase(&p->vFonBits);
  Vec_IntErase(&p->vArray0);
  Vec_IntErase(&p->vArray1);
  if (p->vOther != (Vec_Ptr_t *)0x0) {
    Vec_VecFree((Vec_Vec_t *)p->vOther);
  }
  if (p != (Cba_Ntk_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

static inline void Cba_NtkFree( Cba_Ntk_t * p )
{
    // interface
    Vec_IntErase( &p->vInputs );
    Vec_IntErase( &p->vOutputs );
    Vec_IntErase( &p->vOrder );
    Vec_IntErase( &p->vSeq );
    // stucture
    Vec_StrErase( &p->vObjType );
    Vec_IntErase( &p->vObjFin0 );    
    Vec_IntErase( &p->vObjFon0 );
    Vec_IntErase( &p->vFinFon );    
    Vec_IntErase( &p->vFonObj );    
    // optional
    Vec_IntErase( &p->vObjCopy );    
    Vec_IntErase( &p->vObjFunc );    
    Vec_IntErase( &p->vObjName );    
    Vec_IntErase( &p->vObjAttr );    
    Vec_IntErase( &p->vAttrSto );    
    Vec_IntErase( &p->vFonCopy );    
    Vec_IntErase( &p->vFonName );    
    Vec_IntErase( &p->vFonRange );    
    Vec_IntErase( &p->vFonPrev );    
    Vec_IntErase( &p->vFonNext );    
    Vec_IntErase( &p->vFinFon0 );    
    Vec_IntErase( &p->vFinObj );    
    Vec_IntErase( &p->vNtkObjs );    
    Vec_IntErase( &p->vFonBits );    
    // other
    Vec_IntErase( &p->vArray0 );    
    Vec_IntErase( &p->vArray1 );    
    if ( p->vOther ) Vec_VecFree( (Vec_Vec_t *)p->vOther );
    ABC_FREE( p );
}